

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall sznet::net::TcpServer::start(TcpServer *this)

{
  int iVar1;
  EventLoop *this_00;
  _Bind<void_(sznet::net::Acceptor::*(sznet::net::Acceptor_*))()> local_50;
  Functor local_38;
  
  LOCK();
  iVar1 = (this->m_started).super___atomic_base<int>._M_i;
  (this->m_started).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  if (iVar1 == 0) {
    EventLoopThreadPool::start
              ((this->m_threadPool).
               super___shared_ptr<sznet::net::EventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&this->m_threadInitCallback);
    local_50._M_bound_args.super__Tuple_impl<0UL,_sznet::net::Acceptor_*>.
    super__Head_base<0UL,_sznet::net::Acceptor_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_sznet::net::Acceptor_*>)
         (this->m_acceptor)._M_t.
         super___uniq_ptr_impl<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>.
         _M_t.
         super__Tuple_impl<0UL,_sznet::net::Acceptor_*,_std::default_delete<sznet::net::Acceptor>_>.
         super__Head_base<0UL,_sznet::net::Acceptor_*,_false>._M_head_impl;
    if (((Acceptor *)
        local_50._M_bound_args.super__Tuple_impl<0UL,_sznet::net::Acceptor_*>.
        super__Head_base<0UL,_sznet::net::Acceptor_*,_false>._M_head_impl)->m_listenning == true) {
      __assert_fail("!m_acceptor->listenning()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpServer.cpp"
                    ,0x37,"void sznet::net::TcpServer::start()");
    }
    this_00 = this->m_loop;
    local_50._M_f = (offset_in_Acceptor_to_subr)Acceptor::listen;
    local_50._8_8_ = 0;
    std::function<void()>::
    function<std::_Bind<void(sznet::net::Acceptor::*(sznet::net::Acceptor*))()>,void>
              ((function<void()> *)&local_38,&local_50);
    EventLoop::runInLoop(this_00,&local_38);
    std::_Function_base::~_Function_base(&local_38.super__Function_base);
  }
  return;
}

Assistant:

void TcpServer::start()
{
	if (m_started.exchange(1) == 0)
	{
		m_threadPool->start(m_threadInitCallback);
		assert(!m_acceptor->listenning());
		// listen��������ȷ����m_loop�����߳���ִ��
		m_loop->runInLoop(std::bind(&Acceptor::listen, get_pointer(m_acceptor)));
	}
}